

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zCrcOpt.c
# Opt level: O0

UInt32 CrcUpdateT4(UInt32 v,void *data,size_t size,UInt32 *table)

{
  uint uVar1;
  Byte *p;
  UInt32 *table_local;
  size_t size_local;
  void *data_local;
  UInt32 v_local;
  
  p = (Byte *)data;
  v_local = v;
  for (size_local = size; size_local != 0 && ((ulong)p & 3) != 0; size_local = size_local - 1) {
    v_local = table[(v_local ^ *p) & 0xff] ^ v_local >> 8;
    p = p + 1;
  }
  for (; 3 < size_local; size_local = size_local - 4) {
    uVar1 = *(uint *)p ^ v_local;
    v_local = table[(uVar1 & 0xff) + 0x300] ^ table[(uVar1 >> 8 & 0xff) + 0x200] ^
              table[(uVar1 >> 0x10 & 0xff) + 0x100] ^ table[uVar1 >> 0x18];
    p = p + 4;
  }
  for (; size_local != 0; size_local = size_local - 1) {
    v_local = table[(v_local ^ *p) & 0xff] ^ v_local >> 8;
    p = p + 1;
  }
  return v_local;
}

Assistant:

UInt32 MY_FAST_CALL CrcUpdateT4(UInt32 v, const void *data, size_t size, const UInt32 *table)
{
  const Byte *p = (const Byte *)data;
  for (; size > 0 && ((unsigned)(ptrdiff_t)p & 3) != 0; size--, p++)
    v = CRC_UPDATE_BYTE_2(v, *p);
  for (; size >= 4; size -= 4, p += 4)
  {
    v ^= *(const UInt32 *)p;
    v =
          table[0x300 + ((v      ) & 0xFF)]
        ^ table[0x200 + ((v >>  8) & 0xFF)]
        ^ table[0x100 + ((v >> 16) & 0xFF)]
        ^ table[0x000 + ((v >> 24))];
  }
  for (; size > 0; size--, p++)
    v = CRC_UPDATE_BYTE_2(v, *p);
  return v;
}